

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

int __thiscall capnp::_::OrphanBuilder::truncate(OrphanBuilder *this,char *__file,__off_t __length)

{
  int iVar1;
  int extraout_EAX;
  OrphanBuilder local_40;
  
  iVar1 = truncate(this,__file,0);
  if ((char)iVar1 == '\0') {
    initStructList(&local_40,(BuilderArena *)(this->segment->super_SegmentReader).arena,
                   this->capTable,(ElementCount)__file,SUB84(__length,0));
    operator=(this,&local_40);
    ~OrphanBuilder(&local_40);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void OrphanBuilder::truncate(ElementCount size, StructSize elementSize) {
  if (!truncate(size, false)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initStructList(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size), elementSize);
  }
}